

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageSizeTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::anon_unknown_0::ShaderImageSizeBase::SupportedInStage
          (ShaderImageSizeBase *this,int stage,int required)

{
  ostream *poVar1;
  bool bVar2;
  GLint imagesVS;
  ostringstream reason;
  int local_1bc;
  string local_1b8;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  switch(stage) {
  case 0:
    glu::CallLogWrapper::glGetIntegerv
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x90ca,&local_1bc);
    bVar2 = required <= local_1bc;
    if (required <= local_1bc) {
      return bVar2;
    }
    std::__cxx11::ostringstream::ostringstream(local_198);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Required ",9);
    poVar1 = (ostream *)std::ostream::operator<<(local_198,required);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," VS image uniforms but only ",0x1c);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1bc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," available.",0xb);
    std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    deqp::SubcaseBase::OutputNotSupported(&this->super_SubcaseBase,&local_1b8);
    break;
  case 1:
    glu::CallLogWrapper::glGetIntegerv
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x90cb,&local_1bc);
    bVar2 = required <= local_1bc;
    if (required <= local_1bc) {
      return bVar2;
    }
    std::__cxx11::ostringstream::ostringstream(local_198);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Required ",9);
    poVar1 = (ostream *)std::ostream::operator<<(local_198,required);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," TCS image uniforms but only ",0x1d);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1bc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," available.",0xb);
    std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    deqp::SubcaseBase::OutputNotSupported(&this->super_SubcaseBase,&local_1b8);
    break;
  case 2:
    glu::CallLogWrapper::glGetIntegerv
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x90cc,&local_1bc);
    bVar2 = required <= local_1bc;
    if (required <= local_1bc) {
      return bVar2;
    }
    std::__cxx11::ostringstream::ostringstream(local_198);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Required ",9);
    poVar1 = (ostream *)std::ostream::operator<<(local_198,required);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," TES image uniforms but only ",0x1d);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1bc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," available.",0xb);
    std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    deqp::SubcaseBase::OutputNotSupported(&this->super_SubcaseBase,&local_1b8);
    break;
  case 3:
    glu::CallLogWrapper::glGetIntegerv
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x90cd,&local_1bc);
    bVar2 = required <= local_1bc;
    if (required <= local_1bc) {
      return bVar2;
    }
    std::__cxx11::ostringstream::ostringstream(local_198);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Required ",9);
    poVar1 = (ostream *)std::ostream::operator<<(local_198,required);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," GS image uniforms but only ",0x1c);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1bc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," available.",0xb);
    std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    deqp::SubcaseBase::OutputNotSupported(&this->super_SubcaseBase,&local_1b8);
    break;
  default:
    return true;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return bVar2;
}

Assistant:

bool SupportedInStage(int stage, int required)
	{
		switch (stage)
		{
		case 0:
			return SupportedInVS(required);
		case 1:
			return SupportedInTCS(required);
		case 2:
			return SupportedInTES(required);
		case 3:
			return SupportedInGS(required);
		default:
			return true;
		}
	}